

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall
QMainWindowLayout::applyState(QMainWindowLayout *this,QMainWindowLayoutState *newState,bool animate)

{
  bool bVar1;
  int iVar2;
  Int IVar3;
  QLayout *this_00;
  QTabBar **ppQVar4;
  byte in_DL;
  undefined8 in_RSI;
  QDockAreaLayout *in_RDI;
  long in_FS_OFFSET;
  int i;
  QWidget *sepWidget;
  QSet<QWidget_*> *__range2;
  QTabBar *tab_bar;
  QSet<QTabBar_*> *__range1_1;
  QDockWidgetGroupWindow *dwgw;
  QList<QDockWidgetGroupWindow_*> *__range1;
  const_iterator __end2;
  const_iterator __begin2;
  QSet<QWidget_*> retiredSeps;
  QSet<QWidget_*> usedSeps;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  QSet<QTabBar_*> retired;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QDockWidgetGroupWindow_*> groups;
  QSet<QTabBar_*> used;
  parameter_type in_stack_fffffffffffffed8;
  undefined1 animated;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  byte bVar5;
  int local_fc;
  QDockAreaLayout *in_stack_ffffffffffffff08;
  QWidget *in_stack_ffffffffffffff18;
  QDockAreaLayoutInfo *this_01;
  QFlagsStorageHelper<QMainWindow::DockOption,_4> local_ac;
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined8 in_stack_ffffffffffffff68;
  undefined1 local_58 [32];
  const_iterator local_38 [2];
  undefined1 *local_28;
  QMainWindow *local_20;
  Data *local_18;
  QDockAreaLayoutItem *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((ulong)in_RDI[3].docks[3].separatorWidgets.d.ptr & 1) == 0) {
    *(undefined1 *)&in_RDI[3].docks[3].separatorWidgets.d.ptr = 1;
    local_10 = (QDockAreaLayoutItem *)&DAT_aaaaaaaaaaaaaaaa;
    QDockAreaLayout::usedTabBars(in_RDI);
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = (QMainWindow *)&DAT_aaaaaaaaaaaaaaaa;
    local_18 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    this_00 = (QLayout *)QObject::parent((QObject *)0x5f8de1);
    QFlags<Qt::FindChildOption>::QFlags
              ((QFlags<Qt::FindChildOption> *)
               CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
               (FindChildOption)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    QObject::findChildren<QDockWidgetGroupWindow*>
              (&this_00->super_QObject,
               (QFlagsStorageHelper<Qt::FindChildOption,_4>)
               SUB84((ulong)in_stack_ffffffffffffff18 >> 0x20,0));
    local_38[0].i = (QDockWidgetGroupWindow **)&DAT_aaaaaaaaaaaaaaaa;
    local_38[0] = QList<QDockWidgetGroupWindow_*>::begin
                            ((QList<QDockWidgetGroupWindow_*> *)
                             CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    local_58._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._24_8_ =
         QList<QDockWidgetGroupWindow_*>::end
                   ((QList<QDockWidgetGroupWindow_*> *)
                    CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    while( true ) {
      local_58._16_8_ = local_58._24_8_;
      bVar1 = QList<QDockWidgetGroupWindow_*>::const_iterator::operator!=
                        (local_38,(const_iterator)local_58._24_8_);
      if (!bVar1) break;
      QList<QDockWidgetGroupWindow_*>::const_iterator::operator*(local_38);
      QDockWidgetGroupWindow::layoutInfo((QDockWidgetGroupWindow *)0x5f8eb6);
      QDockAreaLayoutInfo::usedTabBars((QDockAreaLayoutInfo *)in_stack_ffffffffffffff08);
      QSet<QTabBar_*>::operator+=
                ((QSet<QTabBar_*> *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                 (QSet<QTabBar_*> *)in_stack_fffffffffffffed8);
      QSet<QTabBar_*>::~QSet((QSet<QTabBar_*> *)0x5f8ee8);
      QList<QDockWidgetGroupWindow_*>::const_iterator::operator++(local_38);
    }
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ::operator-((QSet<QTabBar_*> *)in_RDI,(QSet<QTabBar_*> *)this_00);
    QSet<QTabBar_*>::operator=
              ((QSet<QTabBar_*> *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
               (QSet<QTabBar_*> *)in_stack_fffffffffffffed8);
    this_01 = (QDockAreaLayoutInfo *)local_58;
    QSet<QTabBar_*>::begin((QSet<QTabBar_*> *)in_RDI);
    QSet<QTabBar_*>::end((QSet<QTabBar_*> *)in_RDI);
    while (bVar1 = QSet<QTabBar_*>::const_iterator::operator!=
                             ((const_iterator *)
                              CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                              (const_iterator *)in_stack_fffffffffffffed8), bVar1) {
      ppQVar4 = QSet<QTabBar_*>::const_iterator::operator*((const_iterator *)0x5f8fe7);
      in_stack_ffffffffffffff18 = &(*ppQVar4)->super_QWidget;
      QWidget::hide((QWidget *)0x5f8ff9);
      while (iVar2 = QTabBar::count((QTabBar *)
                                    CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0)),
            0 < iVar2) {
        QTabBar::removeTab((QTabBar *)this_01,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
      }
      QList<QTabBar_*>::append
                ((QList<QTabBar_*> *)0x5f902c,(parameter_type)in_stack_fffffffffffffed8);
      QSet<QTabBar_*>::const_iterator::operator++
                ((const_iterator *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    }
    if ((int)in_RDI[3].docks[1].item_list.d.size == 1) {
      QDockAreaLayout::usedSeparatorWidgets(in_stack_ffffffffffffff08);
      ::operator-((QSet<QWidget_*> *)in_RDI,(QSet<QWidget_*> *)this_00);
      QSet<QWidget_*>::operator=
                ((QSet<QWidget_*> *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                 (QSet<QWidget_*> *)in_stack_fffffffffffffed8);
      QSet<QWidget_*>::begin((QSet<QWidget_*> *)in_RDI);
      local_a8 = &DAT_aaaaaaaaaaaaaaaa;
      local_a0 = &DAT_aaaaaaaaaaaaaaaa;
      QSet<QWidget_*>::end((QSet<QWidget_*> *)in_RDI);
      while (bVar1 = QSet<QWidget_*>::const_iterator::operator!=
                               ((const_iterator *)
                                CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                                (const_iterator *)in_stack_fffffffffffffed8), bVar1) {
        QSet<QWidget_*>::const_iterator::operator*((const_iterator *)0x5f9162);
        QList<QWidget_*>::append((QList<QWidget_*> *)0x5f9180,in_stack_fffffffffffffed8);
        QWidget::hide((QWidget *)0x5f918a);
        QSet<QWidget_*>::const_iterator::operator++
                  ((const_iterator *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
      }
      QSet<QWidget_*>::~QSet((QSet<QWidget_*> *)0x5f91a6);
      QSet<QWidget_*>::~QSet((QSet<QWidget_*> *)0x5f91b3);
    }
    for (local_fc = 0; local_fc < 4; local_fc = local_fc + 1) {
      QLayout::parentWidget(this_00);
      QDockAreaLayoutInfo::reparentWidgets(this_01,in_stack_ffffffffffffff18);
    }
    local_ac.super_QFlagsStorage<QMainWindow::DockOption>.i =
         (QFlagsStorage<QMainWindow::DockOption>)
         QFlags<QMainWindow::DockOption>::operator&
                   ((QFlags<QMainWindow::DockOption> *)
                    CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                    (DockOption)((ulong)in_RSI >> 0x20));
    animated = (undefined1)((ulong)in_RSI >> 0x38);
    IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_ac);
    bVar5 = 0;
    if (IVar3 != 0) {
      bVar5 = in_DL & 1;
    }
    QMainWindowLayoutState::apply
              ((QMainWindowLayoutState *)CONCAT17(bVar5,in_stack_fffffffffffffee0),(bool)animated);
    *(undefined1 *)&in_RDI[3].docks[3].separatorWidgets.d.ptr = 0;
    QSet<QTabBar_*>::~QSet((QSet<QTabBar_*> *)0x5f9274);
    QList<QDockWidgetGroupWindow_*>::~QList((QList<QDockWidgetGroupWindow_*> *)0x5f9281);
    QSet<QTabBar_*>::~QSet((QSet<QTabBar_*> *)0x5f928e);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMainWindowLayout::applyState(QMainWindowLayoutState &newState, bool animate)
{
    // applying the state can lead to showing separator widgets, which would lead to a re-layout
    // (even though the separator widgets are not really part of the layout)
    // break the loop
    if (isInApplyState)
        return;
    isInApplyState = true;
#if QT_CONFIG(dockwidget) && QT_CONFIG(tabwidget)
    QSet<QTabBar*> used = newState.dockAreaLayout.usedTabBars();
    const auto groups =
            parent()->findChildren<QDockWidgetGroupWindow*>(Qt::FindDirectChildrenOnly);
    for (QDockWidgetGroupWindow *dwgw : groups)
        used += dwgw->layoutInfo()->usedTabBars();

    const QSet<QTabBar*> retired = usedTabBars - used;
    usedTabBars = used;
    for (QTabBar *tab_bar : retired) {
        tab_bar->hide();
        while (tab_bar->count() > 0)
            tab_bar->removeTab(0);
        unusedTabBars.append(tab_bar);
    }

    if (sep == 1) {
        const QSet<QWidget*> usedSeps = newState.dockAreaLayout.usedSeparatorWidgets();
        const QSet<QWidget*> retiredSeps = usedSeparatorWidgets - usedSeps;
        usedSeparatorWidgets = usedSeps;
        for (QWidget *sepWidget : retiredSeps) {
            unusedSeparatorWidgets.append(sepWidget);
            sepWidget->hide();
        }
    }

    for (int i = 0; i < QInternal::DockCount; ++i)
        newState.dockAreaLayout.docks[i].reparentWidgets(parentWidget());

#endif // QT_CONFIG(dockwidget) && QT_CONFIG(tabwidget)
    newState.apply(dockOptions & QMainWindow::AnimatedDocks && animate);
    isInApplyState = false;
}